

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::generateDestProcessMarker
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid,Time returnTime)

{
  bool bVar1;
  Time in_RCX;
  FilterFederate *in_RDI;
  ActionMessage block;
  BaseType fid_index;
  ActionMessage *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ActionMessage *this_00;
  int32_t id;
  value_type_conflict2 *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff11;
  key_type_conflict1 *in_stack_ffffffffffffff28;
  GlobalFederateId in_stack_ffffffffffffff30;
  InterfaceHandle in_stack_ffffffffffffff34;
  GlobalFederateId local_4;
  
  id = (int32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  GlobalFederateId::baseValue(&local_4);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff34.hid,in_stack_ffffffffffffff30.gid),
               in_stack_ffffffffffffff28);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x59dc37);
  if (bVar1) {
    this_00 = (ActionMessage *)&stack0xffffffffffffff28;
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
               (action_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    in_stack_ffffffffffffff30.gid = (in_RDI->mFedID).gid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)this_00,in_stack_fffffffffffffee8);
    ActionMessage::~ActionMessage(this_00);
    id = (int32_t)((ulong)this_00 >> 0x20);
  }
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff34.hid,in_stack_ffffffffffffff30.gid),
               in_stack_ffffffffffffff28);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  addTimeReturn(in_RDI,id,in_RCX);
  return;
}

Assistant:

void FilterFederate::generateDestProcessMarker(GlobalFederateId fid, uint32_t pid, Time returnTime)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    if (ongoingDestFilterProcesses[fid_index].empty()) {
        ActionMessage block(CMD_TIME_BLOCK);
        block.dest_id = fid;
        block.source_id = mFedID;
        block.sequenceID = pid;
        mSendMessage(block);
    }
    ongoingDestFilterProcesses[fid_index].insert(pid);
    addTimeReturn(pid, returnTime);
}